

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splay.c
# Opt level: O0

Curl_tree * Curl_splaygetbest(curltime i,Curl_tree *t,Curl_tree **removed)

{
  undefined4 uVar1;
  Curl_tree *pCVar2;
  uint local_44;
  uint local_40;
  uint local_3c;
  Curl_tree *x;
  Curl_tree **removed_local;
  Curl_tree *t_local;
  curltime i_local;
  
  if (t == (Curl_tree *)0x0) {
    *removed = (Curl_tree *)0x0;
    i_local.tv_usec = 0;
    i_local._12_4_ = 0;
  }
  else {
    pCVar2 = Curl_splay((curltime)ZEXT816((ulong)0),t);
    if (i.tv_sec < (pCVar2->key).tv_sec) {
      local_3c = 0xffffffff;
    }
    else {
      if ((pCVar2->key).tv_sec < i.tv_sec) {
        local_40 = 1;
      }
      else {
        if (i.tv_usec < (pCVar2->key).tv_usec) {
          local_44 = 0xffffffff;
        }
        else {
          local_44 = (uint)((pCVar2->key).tv_usec < i.tv_usec);
        }
        local_40 = local_44;
      }
      local_3c = local_40;
    }
    if ((int)local_3c < 0) {
      *removed = (Curl_tree *)0x0;
      i_local._8_8_ = pCVar2;
    }
    else {
      i_local._8_8_ = pCVar2->samen;
      if ((Curl_tree *)i_local._8_8_ == pCVar2) {
        i_local._8_8_ = pCVar2->larger;
        *removed = pCVar2;
      }
      else {
        (((Curl_tree *)i_local._8_8_)->key).tv_sec = (pCVar2->key).tv_sec;
        uVar1 = *(undefined4 *)&(pCVar2->key).field_0xc;
        (((Curl_tree *)i_local._8_8_)->key).tv_usec = (pCVar2->key).tv_usec;
        *(undefined4 *)&(((Curl_tree *)i_local._8_8_)->key).field_0xc = uVar1;
        ((Curl_tree *)i_local._8_8_)->larger = pCVar2->larger;
        ((Curl_tree *)i_local._8_8_)->smaller = pCVar2->smaller;
        ((Curl_tree *)i_local._8_8_)->samep = pCVar2->samep;
        pCVar2->samep->samen = (Curl_tree *)i_local._8_8_;
        *removed = pCVar2;
      }
    }
  }
  return (Curl_tree *)i_local._8_8_;
}

Assistant:

struct Curl_tree *Curl_splaygetbest(struct curltime i,
                                    struct Curl_tree *t,
                                    struct Curl_tree **removed)
{
  static const struct curltime tv_zero = {0, 0};
  struct Curl_tree *x;

  if(!t) {
    *removed = NULL; /* none removed since there was no root */
    return NULL;
  }

  /* find smallest */
  t = Curl_splay(tv_zero, t);
  if(compare(i, t->key) < 0) {
    /* even the smallest is too big */
    *removed = NULL;
    return t;
  }

  /* FIRST! Check if there is a list with identical keys */
  x = t->samen;
  if(x != t) {
    /* there is, pick one from the list */

    /* 'x' is the new root node */

    x->key = t->key;
    x->larger = t->larger;
    x->smaller = t->smaller;
    x->samep = t->samep;
    t->samep->samen = x;

    *removed = t;
    return x; /* new root */
  }

  /* we splayed the tree to the smallest element, there is no smaller */
  x = t->larger;
  *removed = t;

  return x;
}